

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

uncertain_measurement
units::uncertain_measurement_from_string(string *measurement_string,uint64_t match_flags)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uncertain_measurement uVar4;
  undefined8 uVar5;
  bool bVar6;
  size_type __n;
  size_t sVar7;
  unit uVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  size_type __n_00;
  size_type __size;
  int iVar14;
  char *__s;
  ulong __pos;
  bool bVar15;
  float fVar16;
  unit_data uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> p1;
  measurement m1;
  measurement m2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> p2;
  string local_198;
  unit local_178;
  unit local_170;
  uncertain_measurement local_168;
  unit local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  measurement local_128;
  measurement local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  precise_measurement local_e8;
  unit local_d0;
  size_type local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  unit local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  unit local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  unit local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  unit local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (measurement_string->_M_string_length == 0) {
    local_168.value_ = 0.0;
    local_168.uncertainty_ = 0.0;
    local_168.units_.multiplier_ = 1.0;
    local_168.units_.base_units_ = (unit_data)0x0;
    goto LAB_00410fde;
  }
  __s = "+/-";
  bVar15 = false;
  local_170 = (unit)match_flags;
  __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                  (measurement_string,"+/-",0,3);
  if (__n == 0xffffffffffffffff) {
    lVar11 = 0;
    do {
      bVar15 = lVar11 == 0x40;
      if (bVar15) goto LAB_00410e30;
      __s = *(char **)((long)uncertain_measurement_from_string::pmsequences._M_elems + lVar11 + 8);
      sVar7 = strlen(__s);
      __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (measurement_string,__s,0,sVar7);
      lVar11 = lVar11 + 8;
    } while (__n == 0xffffffffffffffff);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_148,measurement_string,0,__n);
  local_70 = (unit)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_148._M_dataplus._M_p,
             local_148._M_string_length + local_148._M_dataplus._M_p);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  if (local_70 == (unit)&local_60) {
    local_198.field_2._8_8_ = local_60._8_8_;
  }
  else {
    local_198._M_dataplus._M_p = (pointer)local_70;
  }
  local_198.field_2._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
  local_198.field_2._M_local_buf[0] = local_60._M_local_buf[0];
  local_198._M_string_length = local_68;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_70 = (unit)&local_60;
  measurement_from_string((precise_measurement *)&local_108,&local_198,(uint64_t)local_170);
  uVar5 = local_108.field_2._M_allocated_capacity;
  fVar16 = (float)local_108._M_string_length;
  uVar17 = SUB84(local_108._M_string_length >> 0x20,0);
  local_128.value_ = (double)local_108._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    local_178 = (unit)local_108._M_dataplus._M_p;
    local_150.multiplier_ = (float)(undefined4)local_108._M_string_length;
    local_150.base_units_ = (unit_data)local_108._M_string_length._4_4_;
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    fVar16 = local_150.multiplier_;
    uVar17 = local_150.base_units_;
    local_128.value_ = (double)local_178;
  }
  local_128.units_ = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar17,fVar16) | uVar5 << 0x20);
  if (local_70 != (unit)&local_60) {
    operator_delete((void *)local_70,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  sVar7 = strlen(__s);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_108,measurement_string,__n + sVar7,0xffffffffffffffff);
  local_90 = (unit)&local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_108._M_dataplus._M_p,
             local_108._M_string_length + local_108._M_dataplus._M_p);
  if (local_90 == (unit)&local_80) {
    local_198.field_2._8_8_ = local_80._8_8_;
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198._M_dataplus._M_p = (pointer)local_90;
  }
  local_198.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
  local_198.field_2._M_local_buf[0] = local_80._M_local_buf[0];
  local_198._M_string_length = local_88;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_90 = (unit)&local_80;
  measurement_from_string(&local_e8,&local_198,(uint64_t)local_170);
  uVar5 = local_e8.units_._8_8_;
  fVar16 = SUB84(local_e8.units_.multiplier_,0);
  uVar17 = SUB84((ulong)local_e8.units_.multiplier_ >> 0x20,0);
  local_118.value_ = local_e8.value_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    local_178 = (unit)local_e8.value_;
    local_150 = (unit)local_e8.units_.multiplier_;
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    fVar16 = local_150.multiplier_;
    uVar17 = local_150.base_units_;
    local_118.value_ = (double)local_178;
  }
  local_118.units_ = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar17,fVar16) | uVar5 << 0x20);
  if (local_90 != (unit)&local_80) {
    operator_delete((void *)local_90,
                    CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0]) + 1);
  }
  local_198._M_dataplus._M_p = (pointer)local_128.units_;
  bVar6 = unit::operator==((unit *)&local_198,(unit *)&one);
  uVar8 = local_118.units_;
  if (bVar6) {
LAB_00410dcd:
    local_168.uncertainty_ = (float)local_118.value_;
    local_168.value_ = (float)local_128.value_;
    local_168.units_ = uVar8;
  }
  else {
    local_198._M_dataplus._M_p = (pointer)local_118.units_;
    bVar6 = unit::operator==((unit *)&local_198,(unit *)&one);
    uVar8 = local_128.units_;
    if (bVar6) goto LAB_00410dcd;
    uncertain_measurement::uncertain_measurement(&local_168,&local_128,&local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (!bVar15) goto LAB_00410fde;
LAB_00410e30:
  uVar13 = measurement_string->_M_string_length;
  if (uVar13 == 0) {
    __pos = 0xffffffffffffffff;
  }
  else {
    pcVar3 = (measurement_string->_M_dataplus)._M_p;
    pvVar9 = memchr(pcVar3,0x28,uVar13);
    __pos = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)pcVar3;
  }
  if (__pos - 2 < 0xfffffffffffffffd) {
    uVar1 = __pos + 1;
    uVar12 = 0xffffffffffffffff;
    if (uVar1 <= uVar13 && uVar13 - uVar1 != 0) {
      pcVar3 = (measurement_string->_M_dataplus)._M_p;
      pvVar9 = memchr(pcVar3 + uVar1,0x29,uVar13 - uVar1);
      uVar12 = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)pcVar3;
    }
    if (2 < (uVar12 - __pos) - 2) goto LAB_00410ecc;
    iVar14 = (int)__pos;
    pcVar3 = (measurement_string->_M_dataplus)._M_p;
    if ((byte)(pcVar3[(long)iVar14 + -1] - 0x3aU) < 0xf6) goto LAB_00410ecc;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_148,pcVar3,pcVar3 + uVar13);
    if (0 < iVar14) {
      uVar13 = uVar12 - 1;
      lVar11 = ((long)iVar14 - 1U & 0xffffffff) + 1;
      do {
        pcVar3 = (measurement_string->_M_dataplus)._M_p;
        if ((byte)(pcVar3[lVar11 + -1] - 0x30U) < 10) {
          if (__pos < uVar13) {
            (local_148._M_dataplus._M_p + -1)[lVar11] = pcVar3[uVar13];
            uVar13 = uVar13 - 1;
          }
          else {
            (local_148._M_dataplus._M_p + -1)[lVar11] = '0';
          }
        }
        lVar10 = lVar11 + -1;
        bVar15 = 0 < lVar11;
        lVar11 = lVar10;
      } while (lVar10 != 0 && bVar15);
    }
    pcVar3 = (measurement_string->_M_dataplus)._M_p;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar3,pcVar3 + measurement_string->_M_string_length);
    __n_00 = (uVar12 - __pos) + 1;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,__pos
               ,__n_00);
    local_b0 = (unit)&local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_108._M_dataplus._M_p,
               local_108._M_string_length + local_108._M_dataplus._M_p);
    paVar2 = &local_198.field_2;
    if (local_b0 == (unit)&local_a0) {
      local_198.field_2._8_8_ = local_a0._8_8_;
      local_198._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_198._M_dataplus._M_p = (pointer)local_b0;
    }
    local_198.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
    local_198.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
    local_198._M_string_length = local_a8;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_b0 = (unit)&local_a0;
    measurement_from_string(&local_e8,&local_198,(uint64_t)local_170);
    uVar5 = local_e8.units_._8_8_;
    fVar16 = SUB84(local_e8.units_.multiplier_,0);
    uVar17 = SUB84((ulong)local_e8.units_.multiplier_ >> 0x20,0);
    uVar8 = (unit)local_e8.value_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar2) {
      local_178 = (unit)local_e8.value_;
      local_150 = (unit)local_e8.units_.multiplier_;
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      fVar16 = local_150.multiplier_;
      uVar17 = local_150.base_units_;
      uVar8 = local_178;
    }
    local_128.units_ = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar17,fVar16) | uVar5 << 0x20);
    local_128.value_ = (double)uVar8;
    if (local_b0 != (unit)&local_a0) {
      operator_delete((void *)local_b0,
                      CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148,__pos
               ,__n_00);
    local_d0 = (unit)&local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_148._M_dataplus._M_p,
               local_148._M_string_length + local_148._M_dataplus._M_p);
    if (local_d0 == (unit)&local_c0) {
      local_198.field_2._8_8_ = uStack_b8;
      local_198._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_198._M_dataplus._M_p = (pointer)local_d0;
    }
    local_198.field_2._M_allocated_capacity._1_7_ = uStack_bf;
    local_198.field_2._M_local_buf[0] = local_c0;
    local_198._M_string_length = local_c8;
    local_c8 = 0;
    local_c0 = 0;
    local_d0 = (unit)&local_c0;
    measurement_from_string(&local_e8,&local_198,(uint64_t)local_170);
    fVar16 = SUB84(local_e8.units_.multiplier_,0);
    uVar17 = SUB84((ulong)local_e8.units_.multiplier_ >> 0x20,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar2) {
      local_170 = (unit)local_e8.value_;
      local_178 = (unit)local_e8.units_.multiplier_;
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      fVar16 = local_178.multiplier_;
      uVar17 = local_178.base_units_;
      local_e8.value_ = (double)local_170;
    }
    local_118.units_ =
         (unit)((ulong)(uint)(float)(double)CONCAT44(uVar17,fVar16) | local_e8.units_._8_8_ << 0x20)
    ;
    local_118.value_ = local_e8.value_;
    if (local_d0 != (unit)&local_c0) {
      operator_delete((void *)local_d0,CONCAT71(uStack_bf,local_c0) + 1);
    }
    uncertain_measurement::uncertain_measurement(&local_168,&local_128,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    uVar8 = (unit)local_148._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == &local_148.field_2) goto LAB_00410fde;
  }
  else {
LAB_00410ecc:
    pcVar3 = (measurement_string->_M_dataplus)._M_p;
    local_50 = (unit)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + measurement_string->_M_string_length);
    if (local_50 == (unit)&local_40) {
      local_198.field_2._8_8_ = local_40._8_8_;
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    }
    else {
      local_198._M_dataplus._M_p = (pointer)local_50;
    }
    local_198.field_2._M_allocated_capacity._1_7_ = local_40._M_allocated_capacity._1_7_;
    local_198.field_2._M_local_buf[0] = local_40._M_local_buf[0];
    local_198._M_string_length = local_48;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_50 = (unit)&local_40;
    measurement_from_string((precise_measurement *)&local_148,&local_198,(uint64_t)local_170);
    fVar16 = (float)local_148._M_string_length;
    uVar17 = SUB84(local_148._M_string_length >> 0x20,0);
    uVar8 = (unit)local_148._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      local_170 = (unit)local_148._M_dataplus._M_p;
      local_178.multiplier_ = (float)(undefined4)local_148._M_string_length;
      local_178.base_units_ = (unit_data)local_148._M_string_length._4_4_;
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      fVar16 = local_178.multiplier_;
      uVar17 = local_178.base_units_;
      uVar8 = local_170;
    }
    local_168.units_ =
         (unit)((ulong)(uint)(float)(double)CONCAT44(uVar17,fVar16) |
               local_148.field_2._M_allocated_capacity << 0x20);
    local_168.value_ = (float)(double)uVar8;
    local_168.uncertainty_ = 0.0;
    if (local_50 == (unit)&local_40) goto LAB_00410fde;
    local_148.field_2._M_allocated_capacity =
         CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]);
    uVar8 = local_50;
  }
  operator_delete((void *)uVar8,local_148.field_2._M_allocated_capacity + 1);
LAB_00410fde:
  uVar4.uncertainty_ = local_168.uncertainty_;
  uVar4.value_ = local_168.value_;
  uVar4.units_ = local_168.units_;
  return uVar4;
}

Assistant:

uncertain_measurement uncertain_measurement_from_string(
    const std::string& measurement_string,
    std::uint64_t match_flags)
{
    if (measurement_string.empty()) {
        return {};
    }
    // first task is to find the +/-
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<const char*, 9> pmsequences{
        {"+/-",
         "\xB1",
         u8"\u00B1",
         "&plusmn;",
         "+-",
         "<u>+</u>",
         "&#xB1;",
         "&pm;",
         " \\pm "}};

    for (const auto* pmseq : pmsequences) {
        auto loc = measurement_string.find(pmseq);
        if (loc != std::string::npos) {
            auto p1 = measurement_string.substr(0, loc);
            auto m1 = measurement_cast_from_string(p1, match_flags);
            auto p2 = measurement_string.substr(loc + strlen(pmseq));
            auto m2 = measurement_cast_from_string(p2, match_flags);
            if (m1.units() == one) {
                return uncertain_measurement(
                    m1.value(), m2.value(), unit_cast(m2.units()));
            }
            if (m2.units() == one) {
                return uncertain_measurement(m1, m2.value());
            }
            return uncertain_measurement(m1, m2);
        }
    }
    // check for consise form of uncertainty X.XXXXXX(UU) N
    auto loc = measurement_string.find_first_of('(');
    if (loc < std::string::npos && loc > 1) {
        auto eloc = measurement_string.find_first_of(')', loc + 1);
        auto diff = eloc - loc;
        if (diff >= 2 && diff <= 4) {
            int cloc = static_cast<int>(loc) - 1;
            auto lc = eloc - 1;
            char c = measurement_string[cloc];
            if (c >= '0' && c <= '9') {
                auto ustring = measurement_string;
                while (cloc >= 0) {
                    c = measurement_string[cloc];
                    if (c >= '0' && c <= '9') {
                        if (lc > loc) {
                            ustring[cloc] = measurement_string[lc];
                            --lc;
                        } else {
                            ustring[cloc] = '0';
                        }
                    }
                    --cloc;
                }
                auto p = measurement_string;
                p.erase(loc, diff + 1);
                auto m1 = measurement_cast_from_string(p, match_flags);
                ustring.erase(loc, diff + 1);
                auto u1 = measurement_cast_from_string(ustring, match_flags);
                return uncertain_measurement(m1, u1);
            }
        }
    }
    return uncertain_measurement(
        measurement_cast_from_string(measurement_string, match_flags), 0.0F);
}